

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsModuleInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  ModuleVarImport var;
  Type TVar1;
  int i_00;
  AsmJsModuleInfo *this_00;
  FunctionBody *buffer;
  ByteCodeCache *pBVar2;
  Recycler *pRVar3;
  uint *ptr;
  uint **ppuVar4;
  AsmJsSlot *this_01;
  AsmJsSlotMap *this_02;
  uint local_1c4;
  BVStatic<16UL> BStack_1c0;
  uint maxAccess;
  FunctionBody *local_1b8;
  BVStatic<16UL> *arrayBV;
  FunctionBody *local_1a8;
  BVStatic<32UL> *mathBV;
  undefined8 local_198;
  TrackAllocData local_190;
  AsmJsSlot *local_168;
  AsmJsSlot *recyclerSlot;
  AsmJsSlot *slot;
  PropertyId key;
  int i_7;
  AsmJsModuleMemory *modMem;
  uint local_134;
  nullptr_t pvStack_130;
  uint j;
  code *local_128;
  undefined8 local_120;
  TrackAllocData local_118;
  int local_ec;
  undefined1 local_e8 [4];
  int i_6;
  ModuleFunctionTable funcTable;
  int local_d0;
  ModuleFunction local_cc;
  int i_5;
  ModuleFunction modFunc;
  int local_c0;
  Type TStack_bc;
  int i_4;
  ModuleFunctionImport funcImport;
  int local_98;
  ModuleFunctionImport MStack_94;
  int i_3;
  ModuleVarImport varImport;
  ModuleVar *local_70;
  ModuleVar *modVar;
  int i_2;
  RegSlot regSlot;
  int32 loc;
  int i_1;
  RegSlot *exportLocations;
  uint local_48;
  PropertyId propertyId;
  uint i;
  bool boolVal;
  byte extraSlots;
  PropertyIdArray *propArray;
  int local_30;
  int id;
  int exportsCount;
  int count;
  AsmJsModuleInfo *moduleInfo;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  moduleInfo = (AsmJsModuleInfo *)function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  _exportsCount = FunctionBody::AllocateAsmJsModuleInfo(function);
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::SetArgInCount(_exportsCount,id);
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&local_30);
  AsmJsModuleInfo::SetExportsCount(_exportsCount,local_30);
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::InitializeSlotMap(_exportsCount,id);
  if (0 < local_30) {
    _i = AsmJsModuleInfo::GetExportsIdArray(_exportsCount);
    function_local =
         (FunctionBody *)ReadByte(this,(byte *)function_local,(byte *)((long)&propertyId + 3));
    _i->extraSlots = propertyId._3_1_;
    function_local =
         (FunctionBody *)ReadBool(this,(byte *)function_local,(bool *)((long)&propertyId + 2));
    _i->hadDuplicates = (Type)(propertyId._2_1_ & 1);
    function_local =
         (FunctionBody *)ReadBool(this,(byte *)function_local,(bool *)((long)&propertyId + 2));
    _i->has__proto__ = (Type)(propertyId._2_1_ & 1);
    function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
    _i->count = id;
    for (local_48 = 0; local_48 < _i->count; local_48 = local_48 + 1) {
      function_local =
           (FunctionBody *)ReadInt32(this,(byte *)function_local,(int *)((long)&propArray + 4));
      pBVar2 = FunctionBody::GetByteCodeCache((FunctionBody *)moduleInfo);
      exportLocations._4_4_ = ByteCodeCache::LookupPropertyId(pBVar2,propArray._4_4_);
      (&_i[1].count)[local_48] = exportLocations._4_4_;
    }
    _loc = AsmJsModuleInfo::GetExportsFunctionLocation(_exportsCount);
    for (regSlot = 0; (int)regSlot < local_30; regSlot = regSlot + 1) {
      function_local = (FunctionBody *)ReadConstantSizedInt32(this,(byte *)function_local,&i_2);
      _loc[(int)regSlot] = i_2;
    }
  }
  function_local =
       (FunctionBody *)ReadUInt32(this,(byte *)function_local,(uint *)((long)&modVar + 4));
  AsmJsModuleInfo::SetExportFunctionIndex(_exportsCount,modVar._4_4_);
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::SetVarCount(_exportsCount,id);
  for (modVar._0_4_ = 0; (int)modVar < id; modVar._0_4_ = (int)modVar + 1) {
    function_local =
         (FunctionBody *)
         ReadStruct<Js::AsmJsModuleInfo::ModuleVar>(this,(byte *)function_local,&local_70);
    varImport._4_8_ = *(undefined8 *)local_70;
    AsmJsModuleInfo::SetVar(_exportsCount,(int)modVar,*local_70);
  }
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::SetVarImportCount(_exportsCount,id);
  for (local_98 = 0; local_98 < id; local_98 = local_98 + 1) {
    function_local =
         (FunctionBody *)ReadUInt32(this,(byte *)function_local,&stack0xffffffffffffff6c.location);
    function_local = (FunctionBody *)ReadByte(this,(byte *)function_local,(byte *)&i_3);
    function_local =
         (FunctionBody *)ReadInt32(this,(byte *)function_local,(int *)((long)&propArray + 4));
    pBVar2 = FunctionBody::GetByteCodeCache((FunctionBody *)moduleInfo);
    varImport.location = ByteCodeCache::LookupPropertyId(pBVar2,propArray._4_4_);
    funcImport = MStack_94;
    var.field = varImport.location;
    var._0_8_ = MStack_94;
    AsmJsModuleInfo::SetVarImport(_exportsCount,local_98,var);
  }
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::SetFunctionImportCount(_exportsCount,id);
  for (local_c0 = 0; local_c0 < id; local_c0 = local_c0 + 1) {
    function_local = (FunctionBody *)ReadUInt32(this,(byte *)function_local,&TStack_bc);
    function_local =
         (FunctionBody *)ReadInt32(this,(byte *)function_local,(int *)((long)&propArray + 4));
    pBVar2 = FunctionBody::GetByteCodeCache((FunctionBody *)moduleInfo);
    i_4 = ByteCodeCache::LookupPropertyId(pBVar2,propArray._4_4_);
    unique0x1000056c = i_4;
    i_5 = TStack_bc;
    AsmJsModuleInfo::SetFunctionImport(_exportsCount,local_c0,_i_5);
  }
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::SetFunctionCount(_exportsCount,id);
  for (local_d0 = 0; local_d0 < id; local_d0 = local_d0 + 1) {
    function_local = (FunctionBody *)ReadUInt32(this,(byte *)function_local,&local_cc.location);
    funcTable.moduleFunctionIndex.ptr._4_4_ = local_cc.location;
    AsmJsModuleInfo::SetFunction(_exportsCount,local_d0,local_cc);
  }
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  AsmJsModuleInfo::SetFunctionTableCount(_exportsCount,id);
  AsmJsModuleInfo::ModuleFunctionTable::ModuleFunctionTable((ModuleFunctionTable *)local_e8);
  for (local_ec = 0; local_ec < id; local_ec = local_ec + 1) {
    function_local = (FunctionBody *)ReadUInt32(this,(byte *)function_local,(uint *)local_e8);
    if (local_e8 == (undefined1  [4])0x0) {
      pvStack_130 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<unsigned_int>::operator=
                ((WriteBarrierPtr<unsigned_int> *)&funcTable,&stack0xfffffffffffffed0);
    }
    else {
      pRVar3 = ScriptContext::GetRecycler(this->scriptContext);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_118,(type_info *)&unsigned_int::typeinfo,0,(ulong)(uint)local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                 ,0xf88);
      pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_118);
      local_128 = Memory::Recycler::Alloc;
      local_120 = 0;
      ptr = Memory::AllocateArray<Memory::Recycler,unsigned_int,false>
                      ((Memory *)pRVar3,(Recycler *)Memory::Recycler::Alloc,0,(ulong)(uint)local_e8)
      ;
      Memory::WriteBarrierPtr<unsigned_int>::operator=
                ((WriteBarrierPtr<unsigned_int> *)&funcTable,ptr);
    }
    for (local_134 = 0; buffer = function_local, this_00 = _exportsCount, i_00 = local_ec,
        local_134 < (uint)local_e8; local_134 = local_134 + 1) {
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_int__
                          ((WriteBarrierPtr *)&funcTable);
      function_local =
           (FunctionBody *)ReadConstantSizedInt32(this,(byte *)buffer,(int *)(*ppuVar4 + local_134))
      ;
    }
    AsmJsModuleInfo::ModuleFunctionTable::ModuleFunctionTable
              ((ModuleFunctionTable *)&modMem,(ModuleFunctionTable *)local_e8);
    AsmJsModuleInfo::SetFunctionTable(this_00,i_00,(ModuleFunctionTable *)&modMem);
  }
  _key = function_local;
  AsmJsModuleInfo::SetModuleMemory(_exportsCount,(AsmJsModuleMemory *)function_local);
  function_local =
       (FunctionBody *)
       ((long)&(function_local->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.
               ptr + 4);
  function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&id);
  for (slot._4_4_ = 0; slot._4_4_ < id; slot._4_4_ = slot._4_4_ + 1) {
    function_local =
         (FunctionBody *)ReadInt32(this,(byte *)function_local,(int *)((long)&propArray + 4));
    pBVar2 = FunctionBody::GetByteCodeCache((FunctionBody *)moduleInfo);
    slot._0_4_ = ByteCodeCache::LookupPropertyId(pBVar2,propArray._4_4_);
    recyclerSlot = (AsmJsSlot *)function_local;
    function_local =
         (FunctionBody *)
         &(function_local->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
    pRVar3 = ScriptContext::GetRecycler(this->scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_190,(type_info *)&AsmJsSlot::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
               ,0xfa4);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_190);
    mathBV = (BVStatic<32UL> *)Memory::Recycler::AllocInlined;
    local_198 = 0;
    this_01 = (AsmJsSlot *)new<Memory::Recycler>(0x18,pRVar3,0x43c4b0);
    memset(this_01,0,0x18);
    AsmJsSlot::AsmJsSlot(this_01);
    TVar1 = recyclerSlot->symType;
    this_01->location = recyclerSlot->location;
    this_01->symType = TVar1;
    this_01->field_2 = recyclerSlot->field_2;
    this_01->isConstVar = recyclerSlot->isConstVar;
    local_168 = this_01;
    this_02 = AsmJsModuleInfo::GetAsmJsSlotMap(_exportsCount);
    JsUtil::
    BaseDictionary<int,_Js::AsmJsSlot_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Add(this_02,(int *)&slot,&local_168);
  }
  local_1a8 = function_local;
  arrayBV = (BVStatic<16UL> *)
            (function_local->super_ParseableFunctionInfo).super_FunctionProxy.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  function_local =
       (FunctionBody *)&(function_local->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs;
  AsmJsModuleInfo::SetAsmMathBuiltinUsed(_exportsCount,(BVStatic<32UL>)arrayBV);
  local_1b8 = function_local;
  BStack_1c0.data[0].word =
       (Type  [1])
       (function_local->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  function_local =
       (FunctionBody *)&(function_local->super_ParseableFunctionInfo).super_FunctionProxy.auxPtrs;
  AsmJsModuleInfo::SetAsmArrayBuiltinUsed(_exportsCount,BStack_1c0);
  function_local = (FunctionBody *)ReadUInt32(this,(byte *)function_local,&local_1c4);
  AsmJsModuleInfo::SetMaxHeapAccess(_exportsCount,local_1c4);
  return (byte *)function_local;
}

Assistant:

const byte * ReadAsmJsModuleInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsModuleInfo);
#endif
        AsmJsModuleInfo* moduleInfo = function->AllocateAsmJsModuleInfo();

        int count;
        current = ReadInt32(current, &count);
        moduleInfo->SetArgInCount(count);

        int exportsCount;
        current = ReadInt32(current, &exportsCount);
        moduleInfo->SetExportsCount(exportsCount);

        current = ReadInt32(current, &count);
        moduleInfo->InitializeSlotMap(count);

        int id;
        if (exportsCount > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();

            byte extraSlots;
            current = ReadByte(current, &extraSlots);
            propArray->extraSlots = extraSlots;

            bool boolVal;
            current = ReadBool(current, &boolVal);
            propArray->hadDuplicates = boolVal;

            current = ReadBool(current, &boolVal);
            propArray->has__proto__ = boolVal;

            current = ReadInt32(current, &count);
            propArray->count = count;

            for (uint i = 0; i < propArray->count; i++)
            {
                current = ReadInt32(current, &id);
                PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
                propArray->elements[i] = propertyId;
            }

            RegSlot* exportLocations = moduleInfo->GetExportsFunctionLocation();
            for (int i = 0; i < exportsCount; i++)
            {
                int32 loc;
                current = ReadConstantSizedInt32(current, &loc);
                exportLocations[i] = (uint32)loc;
            }
        }
        RegSlot regSlot;
        current = ReadUInt32(current, &regSlot);
        moduleInfo->SetExportFunctionIndex(regSlot);

        current = ReadInt32(current, &count);
        moduleInfo->SetVarCount(count);

        for (int i = 0; i < count; i++)
        {
            serialization_alignment AsmJsModuleInfo::ModuleVar * modVar;
            current = ReadStruct<AsmJsModuleInfo::ModuleVar>(current, &modVar);
            moduleInfo->SetVar(i, *modVar);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetVarImportCount(count);
        AsmJsModuleInfo::ModuleVarImport varImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &varImport.location);
            current = ReadByte(current, (byte*)&varImport.type);
            current = ReadInt32(current, &id);
            varImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetVarImport(i, varImport);
        }


        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionImportCount(count);
        AsmJsModuleInfo::ModuleFunctionImport funcImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcImport.location);
            current = ReadInt32(current, &id);
            funcImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetFunctionImport(i, funcImport);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionCount(count);

        AsmJsModuleInfo::ModuleFunction modFunc;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &modFunc.location);
            moduleInfo->SetFunction(i, modFunc);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionTableCount(count);

        AsmJsModuleInfo::ModuleFunctionTable funcTable;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcTable.size);
            if (funcTable.size > 0)
            {
                funcTable.moduleFunctionIndex = RecyclerNewArray(this->scriptContext->GetRecycler(), RegSlot, funcTable.size);
            }
            else
            {
                funcTable.moduleFunctionIndex = nullptr;
            }
            for (uint j = 0; j < funcTable.size; j++)
            {
                current = ReadConstantSizedInt32(current, (int32*)&funcTable.moduleFunctionIndex[j]);
            }
            moduleInfo->SetFunctionTable(i, funcTable);
        }

        serialization_alignment AsmJsModuleMemory * modMem = (serialization_alignment AsmJsModuleMemory*)current;
        moduleInfo->SetModuleMemory(*modMem);
        current = current + sizeof(serialization_alignment AsmJsModuleMemory);

        current = ReadInt32(current, &count);
        for (int i = 0; i < count; i++)
        {

            current = ReadInt32(current, &id);
            PropertyId key = function->GetByteCodeCache()->LookupPropertyId(id);

            serialization_alignment AsmJsSlot * slot = (serialization_alignment AsmJsSlot*)current;
            current = current + sizeof(serialization_alignment AsmJsSlot);

            // copy the slot to recycler memory
            AsmJsSlot * recyclerSlot = RecyclerNew(scriptContext->GetRecycler(), AsmJsSlot);
            *recyclerSlot = *slot;
            moduleInfo->GetAsmJsSlotMap()->Add(key, recyclerSlot);
        }

        serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE> * mathBV = (serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>);
        moduleInfo->SetAsmMathBuiltinUsed(*mathBV);

        serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE> * arrayBV = (serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>);
        moduleInfo->SetAsmArrayBuiltinUsed(*arrayBV);

        uint maxAccess;
        current = ReadUInt32(current, &maxAccess);
        moduleInfo->SetMaxHeapAccess(maxAccess);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsModuleInfo);
#endif

        return current;
    }